

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

tdefl_sym_freq *
tdefl_radix_sort_syms(mz_uint num_syms,tdefl_sym_freq *pSyms0,tdefl_sym_freq *pSyms1)

{
  ushort uVar1;
  uint uVar2;
  tdefl_sym_freq *ptVar3;
  ulong uVar4;
  uint uVar5;
  bool bVar6;
  tdefl_sym_freq *t;
  uint uStack_c58;
  mz_uint cur_ofs;
  mz_uint offsets [256];
  mz_uint32 *pHist;
  tdefl_sym_freq *ptStack_848;
  mz_uint freq;
  tdefl_sym_freq *pNew_syms;
  tdefl_sym_freq *pCur_syms;
  mz_uint32 hist [512];
  uint local_30;
  uint local_2c;
  mz_uint32 i;
  mz_uint32 pass;
  mz_uint32 pass_shift;
  mz_uint32 total_passes;
  tdefl_sym_freq *pSyms1_local;
  tdefl_sym_freq *pSyms0_local;
  mz_uint num_syms_local;
  
  pass = 2;
  memset(&pCur_syms,0,0x800);
  for (local_30 = 0; local_30 < num_syms; local_30 = local_30 + 1) {
    uVar1 = pSyms0[local_30].m_key;
    uVar4 = (ulong)(uVar1 & 0xff);
    hist[uVar4 - 2] = hist[uVar4 - 2] + 1;
    uVar4 = (ulong)((uVar1 >> 8) + 0x100);
    hist[uVar4 - 2] = hist[uVar4 - 2] + 1;
  }
  while( true ) {
    bVar6 = false;
    if (1 < pass) {
      bVar6 = num_syms == hist[(ulong)((pass - 1) * 0x100) - 2];
    }
    if (!bVar6) break;
    pass = pass - 1;
  }
  i = 0;
  ptStack_848 = pSyms1;
  pNew_syms = pSyms0;
  for (local_2c = 0; local_2c < pass; local_2c = local_2c + 1) {
    offsets._1016_8_ = hist + ((ulong)(local_2c << 8) - 2);
    t._4_4_ = 0;
    for (local_30 = 0; local_30 < 0x100; local_30 = local_30 + 1) {
      (&uStack_c58)[local_30] = t._4_4_;
      t._4_4_ = (hist + ((ulong)(local_2c << 8) - 2))[local_30] + t._4_4_;
    }
    for (local_30 = 0; local_30 < num_syms; local_30 = local_30 + 1) {
      uVar5 = (int)(uint)pNew_syms[local_30].m_key >> ((byte)i & 0x1f) & 0xff;
      uVar2 = (&uStack_c58)[(int)uVar5];
      (&uStack_c58)[(int)uVar5] = uVar2 + 1;
      ptStack_848[uVar2] = pNew_syms[local_30];
    }
    ptVar3 = ptStack_848;
    ptStack_848 = pNew_syms;
    i = i + 8;
    pNew_syms = ptVar3;
  }
  return pNew_syms;
}

Assistant:

static tdefl_sym_freq *tdefl_radix_sort_syms(mz_uint num_syms, tdefl_sym_freq *pSyms0, tdefl_sym_freq *pSyms1)
{
    mz_uint32 total_passes = 2, pass_shift, pass, i, hist[256 * 2];
    tdefl_sym_freq *pCur_syms = pSyms0, *pNew_syms = pSyms1;
    MZ_CLEAR_OBJ(hist);
    for (i = 0; i < num_syms; i++)
    {
        mz_uint freq = pSyms0[i].m_key;
        hist[freq & 0xFF]++;
        hist[256 + ((freq >> 8) & 0xFF)]++;
    }
    while ((total_passes > 1) && (num_syms == hist[(total_passes - 1) * 256]))
        total_passes--;
    for (pass_shift = 0, pass = 0; pass < total_passes; pass++, pass_shift += 8)
    {
        const mz_uint32 *pHist = &hist[pass << 8];
        mz_uint offsets[256], cur_ofs = 0;
        for (i = 0; i < 256; i++)
        {
            offsets[i] = cur_ofs;
            cur_ofs += pHist[i];
        }
        for (i = 0; i < num_syms; i++)
            pNew_syms[offsets[(pCur_syms[i].m_key >> pass_shift) & 0xFF]++] = pCur_syms[i];
        {
            tdefl_sym_freq *t = pCur_syms;
            pCur_syms = pNew_syms;
            pNew_syms = t;
        }
    }
    return pCur_syms;
}